

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statusor_internal.h
# Opt level: O0

void __thiscall
absl::lts_20240722::internal_statusor::
StatusOrData<google::protobuf::json_internal::LocationWith<unsigned_long>_>::~StatusOrData
          (StatusOrData<google::protobuf::json_internal::LocationWith<unsigned_long>_> *this)

{
  bool bVar1;
  StatusOrData<google::protobuf::json_internal::LocationWith<unsigned_long>_> *this_local;
  
  bVar1 = ok(this);
  if (bVar1) {
    Status::~Status((Status *)this);
  }
  else {
    Status::~Status((Status *)this);
  }
  return;
}

Assistant:

~StatusOrData() {
    if (ok()) {
      status_.~Status();
      data_.~T();
    } else {
      status_.~Status();
    }
  }